

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

var __thiscall cs::invoke<cs_impl::any,cs_impl::any>(cs *this,var *func,any *_args,any *_args_1)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar3;
  object_method *poVar4;
  callable *pcVar5;
  runtime_error *this_00;
  long lVar6;
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  vector args;
  allocator_type local_59;
  undefined1 local_58 [32];
  any local_38;
  proxy *local_30;
  proxy *local_28;
  
  if (func->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "N2cs8callableE") {
LAB_001dbd19:
    local_38 = (any)_args->mDat;
    _args->mDat = (proxy *)0x0;
    local_30 = _args_1->mDat;
    _args_1->mDat = (proxy *)0x0;
    __l._M_len = 2;
    __l._M_array = &local_38;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58,__l,&local_59);
    lVar6 = 8;
    do {
      cs_impl::any::recycle((any *)((long)&local_38.mDat + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != -8);
    pcVar5 = cs_impl::any::const_val<cs::callable>(func);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar2 == 0) goto LAB_001dbd19;
    }
    if (func->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if (pcVar1 != "N2cs13object_methodE") {
      if (*pcVar1 == '*') {
LAB_001dbe6e:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"Invoke non-callable object.","");
        runtime_error::runtime_error(this_00,(string *)local_58);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      iVar2 = strcmp(pcVar1,"N2cs13object_methodE");
      if (iVar2 != 0) goto LAB_001dbe6e;
    }
    poVar4 = cs_impl::any::const_val<cs::object_method>(func);
    local_38.mDat = (poVar4->object).mDat;
    if (local_38.mDat != (proxy *)0x0) {
      (local_38.mDat)->refcount = (local_38.mDat)->refcount + 1;
    }
    local_30 = _args->mDat;
    _args->mDat = (proxy *)0x0;
    local_28 = _args_1->mDat;
    _args_1->mDat = (proxy *)0x0;
    __l_00._M_len = 3;
    __l_00._M_array = &local_38;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58,__l_00,&local_59);
    lVar6 = 0x10;
    do {
      cs_impl::any::recycle((any *)((long)&local_38.mDat + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != -8);
    pcVar5 = cs_impl::any::const_val<cs::callable>(&poVar4->callable);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58);
  return (var)(proxy *)this;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}